

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O1

uint32_t __thiscall Confparse::ParseHex(Confparse *this,char *key,uint32_t defaultv)

{
  char *__nptr;
  ulong uVar1;
  int *piVar2;
  uint32_t uVar3;
  
  __nptr = Parse(this,key);
  uVar3 = defaultv;
  if (__nptr != (char *)0x0) {
    if (*__nptr == '0') {
      __nptr = __nptr + (ulong)(__nptr[1] == 'x') * 2;
    }
    uVar1 = strtoul(__nptr,(char **)0x0,0x10);
    piVar2 = __errno_location();
    uVar3 = (uint32_t)uVar1;
    if (*piVar2 == 0x22) {
      uVar3 = defaultv;
    }
  }
  return uVar3;
}

Assistant:

uint32_t Confparse::ParseHex(const char *key, uint32_t defaultv) {
	char *p = Parse(key);
	if (p) {
		uint32_t v;
		if ((*p == '0') && (*(p + 1) == 'x')) {
			p += 2;
		}
		v = strtoul(p, NULL, 16);
		if (errno == ERANGE)
			return defaultv;
		else
			return v;
	} else
		return defaultv;
}